

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpeechBubble.h
# Opt level: O0

void __thiscall SpeechBubble::SpeechBubble(SpeechBubble *this)

{
  SpeechBubble *this_local;
  
  std::__cxx11::string::string((string *)this);
  std::shared_ptr<olc::Renderable>::shared_ptr(&this->sprite);
  SoLoud::Wav::Wav(&this->soundSample);
  this->timeElapsed = 0.0;
  olc::v2d_generic<int>::v2d_generic(&this->position);
  olc::v2d_generic<int>::v2d_generic(&this->scale);
  return;
}

Assistant:

SpeechBubble() = default;